

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O3

int Abc_CommandShow(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wlc_Ntk_t *p;
  bool bVar1;
  int iVar2;
  Vec_Int_t *vBold;
  char *pcVar3;
  
  p = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    do {
      iVar2 = Extra_UtilGetopt(argc,argv,"mvh");
    } while (iVar2 == 0x76);
    if (iVar2 == -1) break;
    if (iVar2 != 0x6d) {
      Abc_Print(-2,"usage: %%show [-mh]\n");
      Abc_Print(-2,"          visualizes the network structure using DOT and GSVIEW\n");
      pcVar3 = "yes";
      if (!bVar1) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-m   :  toggle showing memory subsystem [default = %s]\n",pcVar3);
      pcVar3 = "\t-h   :  print the command usage\n";
      iVar2 = -2;
LAB_0035879e:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (p != (Wlc_Ntk_t *)0x0) {
    if (bVar1) {
      vBold = Wlc_NtkCollectMemory(p,1);
      Wlc_NtkShow(p,vBold);
      if (vBold->pArray != (int *)0x0) {
        free(vBold->pArray);
      }
      free(vBold);
      return 0;
    }
    Wlc_NtkShow(p,(Vec_Int_t *)0x0);
    return 0;
  }
  pcVar3 = "Empty network.\n";
  iVar2 = -1;
  goto LAB_0035879e;
}

Assistant:

int Abc_CommandShow( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Wlc_NtkShow( Wlc_Ntk_t * p, Vec_Int_t * vBold );
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, fMemory = 0, fVerbose = 0;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'm':
            fMemory ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( fMemory )
    {
        Vec_Int_t * vTemp = Wlc_NtkCollectMemory( pNtk, 1 );
        Wlc_NtkShow( pNtk, vTemp );
        Vec_IntFree( vTemp );
    }
    else
        Wlc_NtkShow( pNtk, NULL );
    return 0;

usage:
    Abc_Print( -2, "usage: %%show [-mh]\n" );
    Abc_Print( -2, "          visualizes the network structure using DOT and GSVIEW\n" );
#ifdef WIN32
    Abc_Print( -2, "          \"dot.exe\" and \"gsview32.exe\" should be set in the paths\n" );
    Abc_Print( -2, "          (\"gsview32.exe\" may be in \"C:\\Program Files\\Ghostgum\\gsview\\\")\n" );
#endif
    Abc_Print( -2, "\t-m   :  toggle showing memory subsystem [default = %s]\n", fMemory? "yes": "no" );
    Abc_Print( -2, "\t-h   :  print the command usage\n");
    return 1;
}